

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O2

void cpu_change_pstate_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_pstate)

{
  uint64_t *src;
  uint64_t *dst;
  uint pstate;
  
  if (((env->def).features & 0x2000) == 0) {
    pstate = env->pstate & 0xc01;
    if ((new_pstate & 0xc01) != pstate) {
      src = get_gregset(env,new_pstate & 0xc01);
      dst = get_gregset(env,pstate);
      memcpy32(dst,env->gregs);
      memcpy32(env->gregs,src);
    }
  }
  else {
    new_pstate = new_pstate & 0xfffff3fe;
  }
  env->pstate = new_pstate;
  return;
}

Assistant:

void cpu_change_pstate(CPUSPARCState *env, uint32_t new_pstate)
{
    uint32_t pstate_regs, new_pstate_regs;
    uint64_t *src, *dst;

    if (env->def.features & CPU_FEATURE_GL) {
        /* PS_AG, IG and MG are not implemented in this case */
        new_pstate &= ~(PS_AG | PS_IG | PS_MG);
        env->pstate = new_pstate;
        return;
    }

    pstate_regs = env->pstate & 0xc01;
    new_pstate_regs = new_pstate & 0xc01;

    if (new_pstate_regs != pstate_regs) {
        /* Switch global register bank */
        src = get_gregset(env, new_pstate_regs);
        dst = get_gregset(env, pstate_regs);
        memcpy32(dst, env->gregs);
        memcpy32(env->gregs, src);
    }
    env->pstate = new_pstate;
}